

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_POINT10_v1::read
          (LASreadItemCompressed_POINT10_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  I32 IVar4;
  I32 IVar5;
  I32 IVar6;
  U32 UVar7;
  ArithmeticModel *pAVar8;
  int iVar9;
  U32 UVar10;
  uint uVar11;
  int pred;
  undefined4 in_register_00000034;
  undefined8 *puVar12;
  int pred_00;
  
  puVar12 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  iVar9 = this->last_x_diff[0];
  iVar1 = this->last_x_diff[1];
  iVar2 = this->last_x_diff[2];
  if (iVar9 < iVar1) {
    pred = iVar1;
    if ((iVar2 <= iVar1) && (pred = iVar2, iVar2 < iVar9)) {
      pred = iVar9;
    }
  }
  else {
    pred = iVar9;
    if ((iVar2 <= iVar9) && (pred = iVar2, iVar2 < iVar1)) {
      pred = iVar1;
    }
  }
  iVar9 = this->last_y_diff[0];
  iVar1 = this->last_y_diff[1];
  iVar2 = this->last_y_diff[2];
  if (iVar9 < iVar1) {
    pred_00 = iVar1;
    if ((iVar2 <= iVar1) && (pred_00 = iVar2, iVar2 < iVar9)) {
      pred_00 = iVar9;
    }
  }
  else {
    pred_00 = iVar9;
    if ((iVar2 <= iVar9) && (pred_00 = iVar2, iVar2 < iVar1)) {
      pred_00 = iVar1;
    }
  }
  IVar4 = IntegerCompressor::decompress(this->ic_dx,pred,0);
  *(int *)this->last_item = *(int *)this->last_item + IVar4;
  uVar11 = this->ic_dx->k;
  UVar10 = 0x13;
  if (uVar11 < 0x13) {
    UVar10 = uVar11;
  }
  IVar5 = IntegerCompressor::decompress(this->ic_dy,pred_00,UVar10);
  *(int *)(this->last_item + 4) = *(int *)(this->last_item + 4) + IVar5;
  uVar11 = uVar11 + this->ic_dy->k;
  UVar10 = uVar11 >> 1;
  if (0x12 < UVar10) {
    UVar10 = 0x13;
  }
  IVar6 = IntegerCompressor::decompress(this->ic_z,*(I32 *)(this->last_item + 8),UVar10);
  *(I32 *)(this->last_item + 8) = IVar6;
  UVar10 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar10 != 0) {
    if ((UVar10 & 0x20) != 0) {
      IVar6 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)*(ushort *)(this->last_item + 0xc),0);
      *(short *)(this->last_item + 0xc) = (short)IVar6;
    }
    if ((UVar10 & 0x10) != 0) {
      if (this->m_bit_byte[this->last_item[0xe]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_bit_byte[this->last_item[0xe]]);
      this->last_item[0xe] = (U8)UVar7;
    }
    if ((UVar10 & 8) != 0) {
      if (this->m_classification[this->last_item[0xf]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar7 = ArithmeticDecoder::decodeSymbol
                        (this->dec,this->m_classification[this->last_item[0xf]]);
      this->last_item[0xf] = (U8)UVar7;
    }
    if ((UVar10 & 4) != 0) {
      IVar6 = IntegerCompressor::decompress
                        (this->ic_scan_angle_rank,(uint)this->last_item[0x10],(uint)(uVar11 < 6));
      this->last_item[0x10] = (U8)IVar6;
    }
    if ((UVar10 & 2) != 0) {
      if (this->m_user_data[this->last_item[0x11]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_user_data[this->last_item[0x11]]);
      this->last_item[0x11] = (U8)UVar7;
    }
    if ((UVar10 & 1) != 0) {
      IVar6 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar6;
    }
  }
  this->last_x_diff[this->last_incr] = IVar4;
  this->last_y_diff[this->last_incr] = IVar5;
  iVar9 = this->last_incr + 1;
  if (1 < this->last_incr) {
    iVar9 = 0;
  }
  this->last_incr = iVar9;
  uVar11 = *(uint *)(this->last_item + 0x10);
  *(uint *)(puVar12 + 2) = uVar11;
  uVar3 = *(undefined8 *)(this->last_item + 8);
  *puVar12 = *(undefined8 *)this->last_item;
  puVar12[1] = uVar3;
  return (ulong)uVar11;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v1::read(U8* item, U32& context)
{
  // find median difference for x and y from 3 preceding differences
  I32 median_x;
  if (last_x_diff[0] < last_x_diff[1])
  {
    if (last_x_diff[1] < last_x_diff[2])
      median_x = last_x_diff[1];
    else if (last_x_diff[0] < last_x_diff[2])
      median_x = last_x_diff[2];
    else
      median_x = last_x_diff[0];
  }
  else
  {
    if (last_x_diff[0] < last_x_diff[2])
      median_x = last_x_diff[0];
    else if (last_x_diff[1] < last_x_diff[2])
      median_x = last_x_diff[2];
    else
      median_x = last_x_diff[1];
  }

  I32 median_y;
  if (last_y_diff[0] < last_y_diff[1])
  {
    if (last_y_diff[1] < last_y_diff[2])
      median_y = last_y_diff[1];
    else if (last_y_diff[0] < last_y_diff[2])
      median_y = last_y_diff[2];
    else
      median_y = last_y_diff[0];
  }
  else
  {
    if (last_y_diff[0] < last_y_diff[2])
      median_y = last_y_diff[0];
    else if (last_y_diff[1] < last_y_diff[2])
      median_y = last_y_diff[2];
    else
      median_y = last_y_diff[1];
  }

  // decompress x y z coordinates
  I32 x_diff = ic_dx->decompress(median_x);
  ((LASpoint10*)last_item)->x += x_diff;
  // we use the number k of bits corrector bits to switch contexts
  U32 k_bits = ic_dx->getK();
  I32 y_diff = ic_dy->decompress(median_y, (k_bits < 19 ? k_bits : 19));
  ((LASpoint10*)last_item)->y += y_diff;
  k_bits = (k_bits + ic_dy->getK())/2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(((LASpoint10*)last_item)->z, (k_bits < 19 ? k_bits : 19));

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the intensity if it has changed
    if (changed_values & 32)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(((LASpoint10*)last_item)->intensity);
    }

    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 16)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      last_item[16] = (U8)ic_scan_angle_rank->decompress(last_item[16], k_bits < 3);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }

  // record the difference
  last_x_diff[last_incr] = x_diff;
  last_y_diff[last_incr] = y_diff;
  last_incr++;
  if (last_incr > 2) last_incr = 0;

  // copy the last point
  memcpy(item, last_item, 20);
}